

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_3dmRenderSettings::WriteV5(ON_3dmRenderSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON__UINT32 i;
  
  bVar1 = ON_BinaryArchive::WriteInt(file,0x67);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bCustomImageSize);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_image_width);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_image_height);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_ambient_light);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_background_style);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_background_color);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteString(file,&this->m_background_bitmap_filename);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bUseHiddenLights);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bDepthCue);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bFlatShade);
  }
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  if (bVar1 != false) {
    i = 1;
    if (2 < iVar2) {
      i = (uint)this->m_bRenderBackfaces;
    }
    bVar1 = ON_BinaryArchive::WriteInt(file,i);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bRenderPoints);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bRenderCurves);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bRenderIsoparams);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bRenderMeshEdges);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bRenderAnnotation);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_antialias_style);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_shadowmap_style);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_shadowmap_width);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_shadowmap_height);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_shadowmap_offset);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_image_dpi);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_image_us);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_background_bottom_color);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bScaleBackgroundToFit);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_3dmRenderSettings::WriteV5( ON_BinaryArchive& file ) const
{
  unsigned int i;
  // version 103: 11 November 2010
  const int version = 103;
  bool rc = file.WriteInt( version );
  // version >= 100
  if (rc) rc = file.WriteInt( m_bCustomImageSize );
  if (rc) rc = file.WriteInt( m_image_width );
  if (rc) rc = file.WriteInt( m_image_height );
  if (rc) rc = file.WriteColor( m_ambient_light );
  if (rc) rc = file.WriteInt( m_background_style );
  if (rc) rc = file.WriteColor( m_background_color );
  if (rc) rc = file.WriteString( m_background_bitmap_filename );
  if (rc) rc = file.WriteInt( m_bUseHiddenLights );
  if (rc) rc = file.WriteInt( m_bDepthCue );
  if (rc) rc = file.WriteInt( m_bFlatShade );

  // 26 August 2003 Dale Lear:
  //     When saving V2 files, turn on backfaces. RR 11656
  //
  i = (file.Archive3dmVersion() >= 3) ? m_bRenderBackfaces : 1;
  if (rc) rc = file.WriteInt( i );

  if (rc) rc = file.WriteInt( m_bRenderPoints );
  if (rc) rc = file.WriteInt( m_bRenderCurves );
  if (rc) rc = file.WriteInt( m_bRenderIsoparams );
  if (rc) rc = file.WriteInt( m_bRenderMeshEdges );
  if (rc) rc = file.WriteInt( m_bRenderAnnotation );
  if (rc) rc = file.WriteInt( m_antialias_style );
  if (rc) rc = file.WriteInt( m_shadowmap_style );
  if (rc) rc = file.WriteInt( m_shadowmap_width );
  if (rc) rc = file.WriteInt( m_shadowmap_height );
  if (rc) rc = file.WriteDouble( m_shadowmap_offset );
  // version >= 101 begins here
  if (rc) rc = file.WriteDouble( m_image_dpi );
  i = static_cast<unsigned int>(m_image_us);
  if (rc) rc = file.WriteInt( i );
  // version >= 102 begins here
  if (rc) rc = file.WriteColor( m_background_bottom_color );

  // version >= 103 begins here - added 11 November 2010
  if (rc) rc = file.WriteBool( m_bScaleBackgroundToFit );

  return rc;
}